

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O2

void Gia_ManStaticFanoutStart(Gia_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  int Addition;
  int Addition_00;
  int Addition_01;
  int iVar10;
  
  if (p->vFanoutNums != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanoutNums == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0xf4,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  if (p->vFanout != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanout == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0xf5,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  piVar1 = p->pRefs;
  p->pRefs = (int *)0x0;
  Gia_ManCreateRefs(p);
  piVar2 = p->pRefs;
  iVar10 = p->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = iVar10;
  pVVar7->nCap = iVar10;
  pVVar7->pArray = piVar2;
  p->vFanoutNums = pVVar7;
  p->pRefs = piVar1;
  pVVar7 = Gia_ManStartFanoutMap(p,pVVar7);
  p->vFanout = pVVar7;
  pVVar7 = Vec_IntStart(p->nObjs);
  for (iVar10 = 0; iVar10 < p->nObjs; iVar10 = iVar10 + 1) {
    pGVar8 = Gia_ManObj(p,iVar10);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar8 & 0x1fffffff) != 0x1fffffff) {
      pGVar9 = pGVar8 + -(*(ulong *)pGVar8 & 0x1fffffff);
      iVar3 = Gia_ObjId(p,pGVar9);
      iVar3 = Vec_IntEntry(pVVar7,iVar3);
      Gia_ObjSetFanout(p,pGVar9,iVar3,pGVar8);
      iVar3 = Gia_ObjId(p,pGVar9);
      Vec_IntAddToEntry(pVVar7,iVar3,Addition);
      uVar4 = (uint)*(undefined8 *)pGVar8;
      if ((-1 < (int)uVar4 && (~uVar4 & 0x1fffffff) != 0) &&
         (uVar5 = (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20),
         (uVar4 & 0x1fffffff) == 0x1fffffff || (uVar4 & 0x1fffffff) != (uVar5 & 0x1fffffff))) {
        pGVar9 = pGVar8 + -(ulong)(uVar5 & 0x1fffffff);
        iVar3 = Gia_ObjId(p,pGVar9);
        iVar3 = Vec_IntEntry(pVVar7,iVar3);
        Gia_ObjSetFanout(p,pGVar9,iVar3,pGVar8);
        iVar3 = Gia_ObjId(p,pGVar9);
        Vec_IntAddToEntry(pVVar7,iVar3,Addition_00);
      }
    }
    iVar3 = Gia_ObjId(p,pGVar8);
    if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[iVar3] != 0)) {
      pGVar9 = Gia_ObjFanin2(p,pGVar8);
      iVar3 = Gia_ObjId(p,pGVar9);
      iVar3 = Vec_IntEntry(pVVar7,iVar3);
      Gia_ObjSetFanout(p,pGVar9,iVar3,pGVar8);
      iVar3 = Gia_ObjId(p,pGVar9);
      Vec_IntAddToEntry(pVVar7,iVar3,Addition_01);
    }
  }
  iVar10 = 0;
  while (iVar10 < p->nObjs) {
    pGVar8 = Gia_ManObj(p,iVar10);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    iVar3 = Vec_IntEntry(pVVar7,iVar10);
    iVar6 = Gia_ObjFanoutNum(p,pGVar8);
    iVar10 = iVar10 + 1;
    if (iVar3 != iVar6) {
      __assert_fail("Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                    ,0x11a,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
    }
  }
  free(pVVar7->pArray);
  free(pVVar7);
  return;
}

Assistant:

void Gia_ManStaticFanoutStart( Gia_Man_t * p )
{
    Vec_Int_t * vCounts;
    int * pRefsOld;
    Gia_Obj_t * pObj, * pFanin;
    int i, iFanout;
    assert( p->vFanoutNums == NULL );
    assert( p->vFanout == NULL );
    // recompute reference counters
    pRefsOld = p->pRefs; p->pRefs = NULL;
    Gia_ManCreateRefs(p);
    p->vFanoutNums = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) );
    p->pRefs = pRefsOld;
    // start the fanout maps
    p->vFanout = Gia_ManStartFanoutMap( p, p->vFanoutNums );
    // incrementally add fanouts
    vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pFanin = Gia_ObjFanin0(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj) )
        {
            pFanin = Gia_ObjFanin1(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {

            pFanin = Gia_ObjFanin2(p, pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
    }
    // double-check the current number of fanouts added
    Gia_ManForEachObj( p, pObj, i )
        assert( Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj) );
    Vec_IntFree( vCounts );
}